

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  __m512 x;
  __m512 x_00;
  __m512 x_01;
  __m512 y;
  __m512 y_00;
  __m512 y_01;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int in_ECX;
  undefined1 (*in_RDX) [64];
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar127;
  undefined8 uVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined8 uVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined8 uVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined8 uVar146;
  undefined8 uVar147;
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_ratan2 op;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_42b0;
  undefined8 uStackY_42a8;
  undefined8 local_4280;
  undefined8 uStackY_4278;
  undefined8 uStackY_4270;
  undefined8 uStackY_4268;
  undefined1 local_41c0 [64];
  undefined8 local_4180;
  undefined8 uStackY_4178;
  undefined8 uStackY_4170;
  undefined8 uStackY_4168;
  undefined8 local_4160;
  undefined8 uStackY_4158;
  undefined8 uStackY_4150;
  undefined8 uStackY_4148;
  undefined8 local_4140;
  undefined8 uStackY_4138;
  undefined8 local_4130;
  undefined8 uStackY_4128;
  undefined8 local_4120;
  undefined8 uStackY_4118;
  undefined8 local_4110;
  undefined8 uStackY_4108;
  undefined8 local_4100;
  undefined8 uStackY_40f8;
  undefined8 uStackY_40f0;
  undefined8 uStackY_40e8;
  undefined8 uStackY_40e0;
  undefined8 uStackY_40d8;
  undefined8 uStackY_40d0;
  undefined8 in_stack_ffffffffffffbf38;
  undefined1 in_stack_ffffffffffffbf40 [28];
  undefined4 in_stack_ffffffffffffbf5c;
  int iVar148;
  undefined8 in_stack_ffffffffffffbf60;
  undefined8 in_stack_ffffffffffffbf68;
  undefined8 in_stack_ffffffffffffbf70;
  undefined8 in_stack_ffffffffffffbf78;
  undefined8 in_stack_ffffffffffffbf80;
  undefined8 in_stack_ffffffffffffbf88;
  undefined8 in_stack_ffffffffffffbf90;
  undefined8 in_stack_ffffffffffffbf98;
  undefined8 in_stack_ffffffffffffbfa0;
  undefined8 in_stack_ffffffffffffbfa8;
  undefined8 in_stack_ffffffffffffbfb0;
  undefined1 local_4000 [64];
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  int local_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  int local_3e40;
  undefined1 local_3e39;
  int local_3e38;
  int local_3e34;
  undefined1 (*local_3e30) [64];
  uint *local_3e28;
  undefined1 (*local_3e20) [32];
  undefined1 (*local_3e18) [32];
  undefined1 (*local_3e10) [32];
  undefined1 (*local_3e08) [32];
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined1 (*local_3d88) [64];
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined1 (*local_3d08) [64];
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 uStack_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined1 (*local_3cb8) [64];
  undefined1 (*local_3ca8) [32];
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined1 (*local_3c40) [64];
  uint local_3bb0;
  uint uStack_3bac;
  uint uStack_3ba8;
  uint uStack_3ba4;
  uint local_3b94;
  uint local_3b90;
  uint uStack_3b8c;
  uint uStack_3b88;
  uint uStack_3b84;
  uint local_3b74;
  uint local_3b70;
  uint uStack_3b6c;
  uint uStack_3b68;
  uint uStack_3b64;
  uint local_3b54;
  uint local_3b50;
  uint uStack_3b4c;
  uint uStack_3b48;
  uint uStack_3b44;
  uint local_3b34;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 local_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined1 local_3ac0 [64];
  uint local_3a70;
  uint local_3a6c;
  uint local_3a68;
  uint local_3a64;
  undefined1 local_3a60 [16];
  undefined1 auStack_3a50 [16];
  uint local_3a40;
  uint local_3a3c;
  uint local_3a38;
  uint local_3a34;
  uint local_3a30;
  uint local_3a2c;
  uint local_3a28;
  uint local_3a24;
  undefined1 local_3a20 [16];
  undefined1 auStack_3a10 [16];
  uint local_3a00;
  uint local_39fc;
  uint local_39f8;
  uint local_39f4;
  uint local_39f0;
  uint local_39ec;
  uint local_39e8;
  uint local_39e4;
  undefined1 local_39e0 [16];
  undefined1 auStack_39d0 [16];
  uint local_39c0;
  uint local_39bc;
  uint local_39b8;
  uint local_39b4;
  uint local_39b0;
  uint local_39ac;
  uint local_39a8;
  uint local_39a4;
  undefined1 *local_39a0;
  undefined8 *local_3998;
  undefined1 *local_3990;
  undefined1 *local_3988;
  undefined8 *local_3980;
  undefined1 *local_3978;
  undefined8 *local_3970;
  undefined8 *local_3968;
  undefined1 *local_3960;
  float local_3760;
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  float fStack_3748;
  float fStack_3744;
  float local_3740;
  float fStack_373c;
  float fStack_3738;
  float fStack_3734;
  float fStack_3730;
  float fStack_372c;
  float fStack_3728;
  float fStack_3724;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  float local_2ec0;
  float fStack_2ebc;
  float fStack_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  float fStack_2ea8;
  float fStack_2ea4;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2ae0;
  float fStack_2adc;
  float fStack_2ad8;
  float fStack_2ad4;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  undefined1 *local_22f8;
  undefined1 *local_22f0;
  undefined1 *local_22e8;
  undefined1 local_22e0 [32];
  undefined1 local_22c0 [32];
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined1 local_2280 [32];
  undefined1 local_2260 [32];
  undefined1 local_2240 [32];
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [32];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined1 local_20e0 [8];
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined4 local_20b0;
  undefined4 local_20ac;
  undefined4 local_20a8;
  undefined4 local_20a4;
  undefined1 local_20a0 [16];
  undefined1 auStack_2090 [16];
  undefined4 local_2080;
  undefined4 local_207c;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined4 local_2070;
  undefined4 local_206c;
  undefined4 local_2068;
  undefined4 local_2064;
  undefined1 local_2060 [16];
  undefined1 auStack_2050 [16];
  undefined4 local_2040;
  undefined4 local_203c;
  undefined4 local_2038;
  undefined4 local_2034;
  undefined4 local_2030;
  undefined4 local_202c;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined1 local_2020 [16];
  undefined1 auStack_2010 [16];
  undefined4 local_2000;
  undefined4 local_1ffc;
  undefined4 local_1ff8;
  undefined4 local_1ff4;
  undefined4 local_1ff0;
  undefined4 local_1fec;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined1 local_1fe0 [16];
  undefined1 auStack_1fd0 [16];
  undefined4 local_1fc0;
  undefined4 local_1fbc;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined4 local_1fb0;
  undefined4 local_1fac;
  undefined4 local_1fa8;
  undefined4 local_1fa4;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [32];
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [32];
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [32];
  undefined1 local_1860 [8];
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined1 local_17e0 [16];
  undefined1 auStack_17d0 [16];
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined4 local_1640;
  undefined4 local_163c;
  undefined4 local_1638;
  undefined4 local_1634;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined1 local_1620 [16];
  undefined1 auStack_1610 [16];
  undefined4 local_1600;
  undefined4 local_15fc;
  undefined4 local_15f8;
  undefined4 local_15f4;
  undefined4 local_15f0;
  undefined4 local_15ec;
  undefined4 local_15e8;
  undefined4 local_15e4;
  undefined1 local_15e0 [16];
  undefined1 auStack_15d0 [16];
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  undefined4 local_15a8;
  undefined4 local_15a4;
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  undefined4 local_1580;
  undefined4 local_157c;
  undefined4 local_1578;
  undefined4 local_1574;
  undefined4 local_1570;
  undefined4 local_156c;
  undefined4 local_1568;
  undefined4 local_1564;
  undefined1 local_1560 [16];
  undefined1 auStack_1550 [16];
  undefined4 local_1540;
  undefined4 local_153c;
  undefined4 local_1538;
  undefined4 local_1534;
  undefined4 local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  undefined4 local_1524;
  undefined1 local_1520 [16];
  undefined1 auStack_1510 [16];
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  undefined4 local_14e4;
  undefined1 local_14e0 [16];
  undefined1 auStack_14d0 [16];
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 *local_13a0;
  undefined1 *local_1398;
  float *local_1390;
  undefined8 *local_1388;
  undefined1 *local_1380;
  float *local_1378;
  undefined8 *local_1370;
  undefined1 *local_1368;
  float *local_1360;
  undefined8 *local_1358;
  undefined1 *local_1350;
  float *local_1348;
  undefined8 *local_1340;
  undefined8 *local_1338;
  float *local_1330;
  undefined8 *local_1328;
  undefined1 *local_1320;
  float *local_1318;
  undefined8 *local_1310;
  undefined1 *local_1308;
  float *local_1300;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  float *local_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [32];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  
  local_3e38 = in_R8D;
  local_3e34 = in_ECX;
  local_3e30 = in_RDX;
  local_3e28 = in_RSI;
  local_3e20 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_3e40 = 0; local_3e40 < local_3e34; local_3e40 = local_3e40 + 1) {
      local_3e08 = local_3e20;
      local_3e80 = *(undefined8 *)*local_3e20;
      uStack_3e78 = *(undefined8 *)(*local_3e20 + 8);
      uStack_3e70 = *(undefined8 *)(*local_3e20 + 0x10);
      uStack_3e68 = *(undefined8 *)(*local_3e20 + 0x18);
      uStack_3e60 = *(undefined8 *)local_3e20[1];
      uStack_3e58 = *(undefined8 *)(local_3e20[1] + 8);
      uStack_3e50 = *(undefined8 *)(local_3e20[1] + 0x10);
      uStack_3e48 = *(undefined8 *)(local_3e20[1] + 0x18);
      local_3a70 = *local_3e28;
      local_3ac0 = vbroadcastss_avx512f(ZEXT416(local_3a70));
      local_3ec0 = local_3ac0._0_8_;
      uStack_3eb8 = local_3ac0._8_8_;
      uStack_3eb0 = local_3ac0._16_8_;
      uStack_3ea8 = local_3ac0._24_8_;
      uStack_3ea0 = local_3ac0._32_8_;
      uStack_3e98 = local_3ac0._40_8_;
      uStack_3e90 = local_3ac0._48_8_;
      uStack_3e88 = local_3ac0._56_8_;
      local_3960 = &local_3e39;
      local_3968 = &local_3e80;
      local_3970 = &local_3ec0;
      y[2] = (float)(int)in_stack_ffffffffffffbf80;
      y[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y[0] = (float)(int)in_stack_ffffffffffffbf78;
      y[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y[4] = (float)(int)in_stack_ffffffffffffbf88;
      y[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y[6] = (float)(int)in_stack_ffffffffffffbf90;
      y[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y[8] = (float)(int)in_stack_ffffffffffffbf98;
      y[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x[0] = (float)(int)in_stack_ffffffffffffbf38;
      x[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      x[9] = (float)in_stack_ffffffffffffbf5c;
      x[10] = (float)(int)in_stack_ffffffffffffbf60;
      x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      uVar128 = local_3ac0._0_8_;
      uVar133 = local_3ac0._8_8_;
      uVar138 = local_3ac0._16_8_;
      uVar143 = local_3ac0._24_8_;
      uVar144 = local_3ac0._32_8_;
      uVar145 = local_3ac0._40_8_;
      uVar146 = local_3ac0._48_8_;
      uVar147 = local_3ac0._56_8_;
      atan2512_ps(y,x);
      local_3cb8 = local_3e30;
      auVar29._8_8_ = uVar133;
      auVar29._0_8_ = uVar128;
      auVar29._16_8_ = uVar138;
      auVar29._24_8_ = uVar143;
      auVar29._32_8_ = uVar144;
      auVar29._40_8_ = uVar145;
      auVar29._48_8_ = uVar146;
      auVar29._56_8_ = uVar147;
      *local_3e30 = auVar29;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 1;
      local_3e30 = local_3e30 + 1;
      local_3f00 = uVar128;
      uStack_3ef8 = uVar133;
      uStack_3ef0 = uVar138;
      uStack_3ee8 = uVar143;
      uStack_3ee0 = uVar144;
      uStack_3ed8 = uVar145;
      uStack_3ed0 = uVar146;
      uStack_3ec8 = uVar147;
      local_3d00 = uVar128;
      uStack_3cf8 = uVar133;
      uStack_3cf0 = uVar138;
      uStack_3ce8 = uVar143;
      uStack_3ce0 = uVar144;
      uStack_3cd8 = uVar145;
      uStack_3cd0 = uVar146;
      uStack_3cc8 = uVar147;
    }
  }
  if (local_3e38 == 8) {
    for (local_3f04 = 0; local_3f04 + 1 < local_3e34; local_3f04 = local_3f04 + 2) {
      local_3e10 = local_3e20;
      local_3f80 = *(undefined8 *)*local_3e20;
      uStack_3f78 = *(undefined8 *)(*local_3e20 + 8);
      uStack_3f70 = *(undefined8 *)(*local_3e20 + 0x10);
      uStack_3f68 = *(undefined8 *)(*local_3e20 + 0x18);
      uStack_3f60 = *(undefined8 *)local_3e20[1];
      uStack_3f58 = *(undefined8 *)(local_3e20[1] + 8);
      uStack_3f50 = *(undefined8 *)(local_3e20[1] + 0x10);
      uStack_3f48 = *(undefined8 *)(local_3e20[1] + 0x18);
      local_3a64 = *local_3e28;
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      local_3a60 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      auStack_3a50 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      local_3fa0 = local_3a60._0_8_;
      uStack_3f98 = local_3a60._8_8_;
      uStack_3f90 = auStack_3a50._0_8_;
      uStack_3f88 = auStack_3a50._8_8_;
      local_3a68 = local_3e28[1];
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      local_3a20 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      auStack_3a10 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      local_3fc0 = local_3a20._0_8_;
      uStack_3fb8 = local_3a20._8_8_;
      uStack_3fb0 = auStack_3a10._0_8_;
      uStack_3fa8 = auStack_3a10._8_8_;
      local_3ae0 = local_3a60._0_8_;
      uStack_3ad8 = local_3a60._8_8_;
      uStack_3ad0 = auStack_3a50._0_8_;
      uStack_3ac8 = auStack_3a50._8_8_;
      auVar124._16_8_ = auStack_3a10._0_8_;
      auVar124._0_16_ = local_3a20;
      auVar124._24_8_ = auStack_3a10._8_8_;
      local_4000 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(auStack_3a50._8_8_,
                                                 CONCAT816(auStack_3a50._0_8_,local_3a60))),auVar124
                              ,1);
      local_3978 = &local_3e39;
      local_3980 = &local_3f80;
      local_3988 = local_4000;
      y_00[2] = (float)(int)in_stack_ffffffffffffbf80;
      y_00[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y_00[0] = (float)(int)in_stack_ffffffffffffbf78;
      y_00[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y_00[4] = (float)(int)in_stack_ffffffffffffbf88;
      y_00[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y_00[6] = (float)(int)in_stack_ffffffffffffbf90;
      y_00[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y_00[8] = (float)(int)in_stack_ffffffffffffbf98;
      y_00[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y_00[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y_00[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y_00[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x_00[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x_00[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x_00[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x_00[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x_00[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x_00[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x_00[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x_00[0] = (float)(int)in_stack_ffffffffffffbf38;
      x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      x_00[9] = (float)in_stack_ffffffffffffbf5c;
      x_00[10] = (float)(int)in_stack_ffffffffffffbf60;
      x_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x_00[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x_00[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      uVar128 = local_4000._0_8_;
      uVar133 = local_4000._8_8_;
      uVar138 = local_4000._16_8_;
      uVar143 = local_4000._24_8_;
      uVar144 = local_4000._32_8_;
      uVar145 = local_4000._40_8_;
      uVar146 = local_4000._48_8_;
      uVar147 = local_4000._56_8_;
      local_3a40 = local_3a64;
      local_3a3c = local_3a64;
      local_3a38 = local_3a64;
      local_3a34 = local_3a64;
      local_3a30 = local_3a64;
      local_3a2c = local_3a64;
      local_3a28 = local_3a64;
      local_3a24 = local_3a64;
      local_3a00 = local_3a68;
      local_39fc = local_3a68;
      local_39f8 = local_3a68;
      local_39f4 = local_3a68;
      local_39f0 = local_3a68;
      local_39ec = local_3a68;
      local_39e8 = local_3a68;
      local_39e4 = local_3a68;
      atan2512_ps(y_00,x_00);
      local_3d08 = local_3e30;
      auVar28._8_8_ = uVar133;
      auVar28._0_8_ = uVar128;
      auVar28._16_8_ = uVar138;
      auVar28._24_8_ = uVar143;
      auVar28._32_8_ = uVar144;
      auVar28._40_8_ = uVar145;
      auVar28._48_8_ = uVar146;
      auVar28._56_8_ = uVar147;
      *local_3e30 = auVar28;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 2;
      local_3e30 = local_3e30 + 1;
      local_3d80 = uVar128;
      uStack_3d78 = uVar133;
      uStack_3d70 = uVar138;
      uStack_3d68 = uVar143;
      uStack_3d60 = uVar144;
      uStack_3d58 = uVar145;
      uStack_3d50 = uVar146;
      uStack_3d48 = uVar147;
    }
    for (; local_3f04 < local_3e34; local_3f04 = local_3f04 + 1) {
      local_3ca8 = local_3e20;
      in_stack_ffffffffffffbfa0 = *(undefined8 *)*local_3e20;
      in_stack_ffffffffffffbfa8 = *(undefined8 *)(*local_3e20 + 8);
      in_stack_ffffffffffffbfb0 = *(undefined8 *)(*local_3e20 + 0x10);
      uStack_2128 = *(undefined8 *)(*local_3e20 + 0x18);
      local_3a6c = *local_3e28;
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      local_39e0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      auStack_39d0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      local_2120 = local_39e0._0_8_;
      uStack_2118 = local_39e0._8_8_;
      uStack_2110 = auStack_39d0._0_8_;
      uStack_2108 = auStack_39d0._8_8_;
      local_22e8 = &local_3e39;
      local_22f0 = &stack0xffffffffffffbfa0;
      local_22f8 = &stack0xffffffffffffbf80;
      auVar71._16_8_ = auStack_39d0._0_8_;
      auVar71._0_16_ = local_39e0;
      auVar71._24_8_ = auStack_39d0._8_8_;
      auVar70._16_8_ = auStack_39d0._0_8_;
      auVar70._0_16_ = local_39e0;
      auVar70._24_8_ = auStack_39d0._8_8_;
      auVar69._16_8_ = auStack_39d0._0_8_;
      auVar69._0_16_ = local_39e0;
      auVar69._24_8_ = auStack_39d0._8_8_;
      auVar68._16_8_ = auStack_39d0._0_8_;
      auVar68._0_16_ = local_39e0;
      auVar68._24_8_ = auStack_39d0._8_8_;
      local_20a4 = 0;
      local_2080 = 0;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      local_20a0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auStack_2090 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      local_2160 = local_20a0._0_8_;
      uStack_2158 = local_20a0._8_8_;
      uStack_2150 = auStack_2090._0_8_;
      uStack_2148 = auStack_2090._8_8_;
      local_20a8 = 0x80000000;
      local_2040 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_2060 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_2050 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_2180 = local_2060._0_8_;
      uStack_2178 = local_2060._8_8_;
      uStack_2170 = auStack_2050._0_8_;
      uStack_2168 = auStack_2050._8_8_;
      local_20ac = 0x40490fdb;
      local_2000 = 0x40490fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      local_2020 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      auStack_2010 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      local_21a0 = local_2020._0_8_;
      uStack_2198 = local_2020._8_8_;
      uStack_2190 = auStack_2010._0_8_;
      uStack_2188 = auStack_2010._8_8_;
      local_20b0 = 0x3fc90fdb;
      local_1fc0 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_1fe0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_1fd0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_21c0 = local_1fe0._0_8_;
      uStack_21b8 = local_1fe0._8_8_;
      uStack_21b0 = auStack_1fd0._0_8_;
      uStack_21a8 = auStack_1fd0._8_8_;
      auVar2._16_8_ = auStack_2090._0_8_;
      auVar2._0_16_ = local_20a0;
      auVar2._24_8_ = auStack_2090._8_8_;
      local_21e0 = vcmpps_avx(*local_3e20,auVar2,4);
      auVar125._16_8_ = auStack_2090._0_8_;
      auVar125._0_16_ = local_20a0;
      auVar125._24_8_ = auStack_2090._8_8_;
      local_2200 = vcmpps_avx(auVar68,auVar125,4);
      local_1d80 = local_21e0._0_8_;
      uStack_1d78 = local_21e0._8_8_;
      uStack_1d70 = local_21e0._16_8_;
      uStack_1d68 = local_21e0._24_8_;
      local_1da0 = local_2200._0_8_;
      uStack_1d98 = local_2200._8_8_;
      uStack_1d90 = local_2200._16_8_;
      uStack_1d88 = local_2200._24_8_;
      local_2220 = vpand_avx2(local_21e0,local_2200);
      local_1dc0 = local_2060._0_8_;
      uStack_1db8 = local_2060._8_8_;
      uStack_1db0 = auStack_2050._0_8_;
      uStack_1da8 = auStack_2050._8_8_;
      auVar19._16_8_ = auStack_2050._0_8_;
      auVar19._0_16_ = local_2060;
      auVar19._24_8_ = auStack_2050._8_8_;
      local_2240 = vpand_avx2(auVar19,*local_3e20);
      local_1e00 = local_2060._0_8_;
      uStack_1df8 = local_2060._8_8_;
      uStack_1df0 = auStack_2050._0_8_;
      uStack_1de8 = auStack_2050._8_8_;
      auVar18._16_8_ = auStack_2050._0_8_;
      auVar18._0_16_ = local_2060;
      auVar18._24_8_ = auStack_2050._8_8_;
      local_2260 = vpand_avx2(auVar18,auVar69);
      auVar13._16_8_ = auStack_2090._0_8_;
      auVar13._0_16_ = local_20a0;
      auVar13._24_8_ = auStack_2090._8_8_;
      local_1e80 = vcmpps_avx(*local_3e20,auVar13,1);
      local_1e40 = vcmpps_avx(auVar70,auVar13,1);
      local_1e60 = local_2060._0_8_;
      uStack_1e58 = local_2060._8_8_;
      uStack_1e50 = auStack_2050._0_8_;
      uStack_1e48 = auStack_2050._8_8_;
      auVar17._16_8_ = auStack_2050._0_8_;
      auVar17._0_16_ = local_2060;
      auVar17._24_8_ = auStack_2050._8_8_;
      local_1c00 = vpand_avx2(local_1e40,auVar17);
      local_1c20 = local_2020._0_8_;
      uStack_1c18 = local_2020._8_8_;
      uStack_1c10 = auStack_2010._0_8_;
      uStack_1c08 = auStack_2010._8_8_;
      auVar52._16_8_ = auStack_2010._0_8_;
      auVar52._0_16_ = local_2020;
      auVar52._24_8_ = auStack_2010._8_8_;
      local_1ea0 = vpor_avx2(local_1c00,auVar52);
      local_2280 = vpand_avx2(local_1e80,local_1ea0);
      local_1880 = vdivps_avx(auVar71,*local_3e20);
      local_17e4 = 0x80000000;
      local_17c0 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_17e0 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_17d0 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_18a0 = local_17e0._0_8_;
      uStack_1898 = local_17e0._8_8_;
      uStack_1890 = auStack_17d0._0_8_;
      uStack_1888 = auStack_17d0._8_8_;
      local_17e8 = 0x3f800000;
      local_1780 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_17a0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_1790 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_18c0 = local_17a0._0_8_;
      uStack_18b8 = local_17a0._8_8_;
      uStack_18b0 = auStack_1790._0_8_;
      uStack_18a8 = auStack_1790._8_8_;
      local_17ec = 0xbf800000;
      local_1740 = 0xbf800000;
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      local_1760 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      auStack_1750 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      local_18e0 = local_1760._0_8_;
      uStack_18d8 = local_1760._8_8_;
      uStack_18d0 = auStack_1750._0_8_;
      uStack_18c8 = auStack_1750._8_8_;
      local_17f0 = 0x3fc90fdb;
      local_1700 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_1720 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_1710 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_1900 = local_1720._0_8_;
      uStack_18f8 = local_1720._8_8_;
      uStack_18f0 = auStack_1710._0_8_;
      uStack_18e8 = auStack_1710._8_8_;
      local_17f4 = 0x3f800000;
      local_16c0 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_16e0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_16d0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1920 = local_16e0._0_8_;
      uStack_1918 = local_16e0._8_8_;
      uStack_1910 = auStack_16d0._0_8_;
      uStack_1908 = auStack_16d0._8_8_;
      local_17f8 = 0xbeaaaa53;
      local_1680 = 0xbeaaaa53;
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      local_16a0 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      auStack_1690 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      local_1940 = local_16a0._0_8_;
      uStack_1938 = local_16a0._8_8_;
      uStack_1930 = auStack_1690._0_8_;
      uStack_1928 = auStack_1690._8_8_;
      local_17fc = 0x3e4cb974;
      local_1640 = 0x3e4cb974;
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      local_1660 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      auStack_1650 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      local_1960 = local_1660._0_8_;
      uStack_1958 = local_1660._8_8_;
      uStack_1950 = auStack_1650._0_8_;
      uStack_1948 = auStack_1650._8_8_;
      local_1800 = 0xbe117200;
      local_1600 = 0xbe117200;
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      local_1620 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      auStack_1610 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      local_1980 = local_1620._0_8_;
      uStack_1978 = local_1620._8_8_;
      uStack_1970 = auStack_1610._0_8_;
      uStack_1968 = auStack_1610._8_8_;
      local_1804 = 0x3dd9ed24;
      local_15c0 = 0x3dd9ed24;
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      local_15e0 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      auStack_15d0 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      local_19a0 = local_15e0._0_8_;
      uStack_1998 = local_15e0._8_8_;
      uStack_1990 = auStack_15d0._0_8_;
      uStack_1988 = auStack_15d0._8_8_;
      local_1808 = 0xbd99b01e;
      local_1580 = 0xbd99b01e;
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      local_15a0 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      auStack_1590 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      local_19c0 = local_15a0._0_8_;
      uStack_19b8 = local_15a0._8_8_;
      uStack_19b0 = auStack_1590._0_8_;
      uStack_19a8 = auStack_1590._8_8_;
      local_180c = 0x3d2edd4e;
      local_1540 = 0x3d2edd4e;
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      local_1560 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      auStack_1550 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      local_19e0 = local_1560._0_8_;
      uStack_19d8 = local_1560._8_8_;
      uStack_19d0 = auStack_1550._0_8_;
      uStack_19c8 = auStack_1550._8_8_;
      local_1810 = 0xbc83a25c;
      local_1500 = 0xbc83a25c;
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      local_1520 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      auStack_1510 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      local_1a00 = local_1520._0_8_;
      uStack_19f8 = local_1520._8_8_;
      uStack_19f0 = auStack_1510._0_8_;
      uStack_19e8 = auStack_1510._8_8_;
      local_1814 = 0x3b3ac537;
      local_14c0 = 0x3b3ac537;
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      local_14e0 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      auStack_14d0 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      local_1a20 = local_14e0._0_8_;
      uStack_1a18 = local_14e0._8_8_;
      uStack_1a10 = auStack_14d0._0_8_;
      uStack_1a08 = auStack_14d0._8_8_;
      local_1200 = local_17e0._0_8_;
      uStack_11f8 = local_17e0._8_8_;
      uStack_11f0 = auStack_17d0._0_8_;
      uStack_11e8 = auStack_17d0._8_8_;
      local_1220 = local_1880._0_8_;
      uStack_1218 = local_1880._8_8_;
      uStack_1210 = local_1880._16_8_;
      uStack_1208 = local_1880._24_8_;
      auVar56._16_8_ = auStack_17d0._0_8_;
      auVar56._0_16_ = local_17e0;
      auVar56._24_8_ = auStack_17d0._8_8_;
      local_1a40 = vpand_avx2(auVar56,local_1880);
      local_d80 = local_17e0._0_8_;
      uStack_d78 = local_17e0._8_8_;
      uStack_d70 = auStack_17d0._0_8_;
      uStack_d68 = auStack_17d0._8_8_;
      local_da0 = local_1880._0_8_;
      uStack_d98 = local_1880._8_8_;
      uStack_d90 = local_1880._16_8_;
      uStack_d88 = local_1880._24_8_;
      auVar59._16_8_ = auStack_17d0._0_8_;
      auVar59._0_16_ = local_17e0;
      auVar59._24_8_ = auStack_17d0._8_8_;
      local_1a60 = vpandn_avx2(auVar59,local_1880);
      auVar53._16_8_ = auStack_1790._0_8_;
      auVar53._0_16_ = local_17a0;
      auVar53._24_8_ = auStack_1790._8_8_;
      local_1a80 = vcmpps_avx(auVar53,local_1a60,1);
      local_1240 = local_1a80._0_8_;
      uStack_1238 = local_1a80._8_8_;
      uStack_1230 = local_1a80._16_8_;
      uStack_1228 = local_1a80._24_8_;
      local_1260 = local_1760._0_8_;
      uStack_1258 = local_1760._8_8_;
      uStack_1250 = auStack_1750._0_8_;
      uStack_1248 = auStack_1750._8_8_;
      auVar55._16_8_ = auStack_1750._0_8_;
      auVar55._0_16_ = local_1760;
      auVar55._24_8_ = auStack_1750._8_8_;
      local_e40 = vpand_avx2(local_1a80,auVar55);
      local_dc0 = local_1a80._0_8_;
      uStack_db8 = local_1a80._8_8_;
      uStack_db0 = local_1a80._16_8_;
      uStack_da8 = local_1a80._24_8_;
      local_de0 = local_1a60._0_8_;
      uStack_dd8 = local_1a60._8_8_;
      uStack_dd0 = local_1a60._16_8_;
      uStack_dc8 = local_1a60._24_8_;
      local_e60 = vpandn_avx2(local_1a80,local_1a60);
      local_13c0 = vpor_avx2(local_e40,local_e60);
      local_1280 = local_1a80._0_8_;
      uStack_1278 = local_1a80._8_8_;
      uStack_1270 = local_1a80._16_8_;
      uStack_1268 = local_1a80._24_8_;
      local_12a0 = local_1a60._0_8_;
      uStack_1298 = local_1a60._8_8_;
      uStack_1290 = local_1a60._16_8_;
      uStack_1288 = local_1a60._24_8_;
      local_e80 = vpand_avx2(local_1a80,local_1a60);
      local_e00 = local_1a80._0_8_;
      uStack_df8 = local_1a80._8_8_;
      uStack_df0 = local_1a80._16_8_;
      uStack_de8 = local_1a80._24_8_;
      local_e20 = local_17a0._0_8_;
      uStack_e18 = local_17a0._8_8_;
      uStack_e10 = auStack_1790._0_8_;
      uStack_e08 = auStack_1790._8_8_;
      auVar58._16_8_ = auStack_1790._0_8_;
      auVar58._0_16_ = local_17a0;
      auVar58._24_8_ = auStack_1790._8_8_;
      local_ea0 = vpandn_avx2(local_1a80,auVar58);
      local_13e0 = vpor_avx2(local_e80,local_ea0);
      local_1aa0 = vdivps_avx(local_13c0,local_13e0);
      local_1420 = local_1aa0._0_8_;
      uStack_1418 = local_1aa0._8_8_;
      uStack_1410 = local_1aa0._16_8_;
      uStack_1408 = local_1aa0._24_8_;
      local_1400._0_4_ = local_1aa0._0_4_;
      local_1400._4_4_ = local_1aa0._4_4_;
      uStack_13f8._0_4_ = local_1aa0._8_4_;
      uStack_13f8._4_4_ = local_1aa0._12_4_;
      uStack_13f0._0_4_ = local_1aa0._16_4_;
      uStack_13f0._4_4_ = local_1aa0._20_4_;
      uStack_13e8._0_4_ = local_1aa0._24_4_;
      uStack_13e8._4_4_ = local_1aa0._28_4_;
      fStack_1aa4 = uStack_13e8._4_4_;
      local_1ac0 = (float)local_1400 * (float)local_1400;
      fStack_1abc = local_1400._4_4_ * local_1400._4_4_;
      fStack_1ab8 = (float)uStack_13f8 * (float)uStack_13f8;
      fStack_1ab4 = uStack_13f8._4_4_ * uStack_13f8._4_4_;
      fStack_1ab0 = (float)uStack_13f0 * (float)uStack_13f0;
      fStack_1aac = uStack_13f0._4_4_ * uStack_13f0._4_4_;
      fStack_1aa8 = (float)uStack_13e8 * (float)uStack_13e8;
      local_1460 = CONCAT44(fStack_1abc,local_1ac0);
      uStack_1458 = CONCAT44(fStack_1ab4,fStack_1ab8);
      uStack_1450 = CONCAT44(fStack_1aac,fStack_1ab0);
      uStack_1448 = CONCAT44(uStack_13e8._4_4_,fStack_1aa8);
      fStack_1ac4 = uStack_13e8._4_4_;
      local_1ae0 = local_1ac0 * local_1ac0;
      fStack_1adc = fStack_1abc * fStack_1abc;
      fStack_1ad8 = fStack_1ab8 * fStack_1ab8;
      fStack_1ad4 = fStack_1ab4 * fStack_1ab4;
      fStack_1ad0 = fStack_1ab0 * fStack_1ab0;
      fStack_1acc = fStack_1aac * fStack_1aac;
      fStack_1ac8 = fStack_1aa8 * fStack_1aa8;
      local_1378 = &local_1ae0;
      local_12f0 = &local_1a00;
      local_12f8 = &local_19c0;
      local_11a0 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_1198 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_1190 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_1188 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar89._4_4_ = fStack_1adc;
      auVar89._0_4_ = local_1ae0;
      auVar89._8_4_ = fStack_1ad8;
      auVar89._12_4_ = fStack_1ad4;
      auVar89._16_4_ = fStack_1ad0;
      auVar89._20_4_ = fStack_1acc;
      auVar89._24_4_ = fStack_1ac8;
      auVar89._28_4_ = uStack_13e8._4_4_;
      local_11c0 = local_1520._0_8_;
      uStack_11b8 = local_1520._8_8_;
      uStack_11b0 = auStack_1510._0_8_;
      uStack_11a8 = auStack_1510._8_8_;
      auVar98._16_8_ = auStack_1510._0_8_;
      auVar98._0_16_ = local_1520;
      auVar98._24_8_ = auStack_1510._8_8_;
      local_11e0 = local_15a0._0_8_;
      uStack_11d8 = local_15a0._8_8_;
      uStack_11d0 = auStack_1590._0_8_;
      uStack_11c8 = auStack_1590._8_8_;
      auVar100._16_8_ = auStack_1590._0_8_;
      auVar100._0_16_ = local_15a0;
      auVar100._24_8_ = auStack_1590._8_8_;
      auVar3 = vfmadd213ps_fma(auVar98,auVar89,auVar100);
      local_1308 = local_1b60;
      local_1310 = &local_1980;
      local_1140 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_1138 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_1130 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_1128 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar90._4_4_ = fStack_1adc;
      auVar90._0_4_ = local_1ae0;
      auVar90._8_4_ = fStack_1ad8;
      auVar90._12_4_ = fStack_1ad4;
      auVar90._16_4_ = fStack_1ad0;
      auVar90._20_4_ = fStack_1acc;
      auVar90._24_4_ = fStack_1ac8;
      auVar90._28_4_ = uStack_13e8._4_4_;
      local_1b60._0_8_ = auVar3._0_8_;
      local_1160 = local_1b60._0_8_;
      local_1b60._8_8_ = auVar3._8_8_;
      uStack_1158 = local_1b60._8_8_;
      uStack_1150 = 0;
      uStack_1148 = 0;
      local_1180 = local_1620._0_8_;
      uStack_1178 = local_1620._8_8_;
      uStack_1170 = auStack_1610._0_8_;
      uStack_1168 = auStack_1610._8_8_;
      auVar102._16_8_ = auStack_1610._0_8_;
      auVar102._0_16_ = local_1620;
      auVar102._24_8_ = auStack_1610._8_8_;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar90,auVar102);
      local_1320 = local_1b40;
      local_1328 = &local_1940;
      local_10e0 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_10d8 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_10d0 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_10c8 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar91._4_4_ = fStack_1adc;
      auVar91._0_4_ = local_1ae0;
      auVar91._8_4_ = fStack_1ad8;
      auVar91._12_4_ = fStack_1ad4;
      auVar91._16_4_ = fStack_1ad0;
      auVar91._20_4_ = fStack_1acc;
      auVar91._24_4_ = fStack_1ac8;
      auVar91._28_4_ = uStack_13e8._4_4_;
      local_1b40._0_8_ = auVar20._0_8_;
      local_1100 = local_1b40._0_8_;
      local_1b40._8_8_ = auVar20._8_8_;
      uStack_10f8 = local_1b40._8_8_;
      uStack_10f0 = 0;
      uStack_10e8 = 0;
      local_1120 = local_16a0._0_8_;
      uStack_1118 = local_16a0._8_8_;
      uStack_1110 = auStack_1690._0_8_;
      uStack_1108 = auStack_1690._8_8_;
      auVar104._16_8_ = auStack_1690._0_8_;
      auVar104._0_16_ = local_16a0;
      auVar104._24_8_ = auStack_1690._8_8_;
      auVar123 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar91,auVar104);
      local_1338 = &local_1a20;
      local_1340 = &local_19e0;
      local_1080 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_1078 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_1070 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_1068 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar92._4_4_ = fStack_1adc;
      auVar92._0_4_ = local_1ae0;
      auVar92._8_4_ = fStack_1ad8;
      auVar92._12_4_ = fStack_1ad4;
      auVar92._16_4_ = fStack_1ad0;
      auVar92._20_4_ = fStack_1acc;
      auVar92._24_4_ = fStack_1ac8;
      auVar92._28_4_ = uStack_13e8._4_4_;
      local_10a0 = local_14e0._0_8_;
      uStack_1098 = local_14e0._8_8_;
      uStack_1090 = auStack_14d0._0_8_;
      uStack_1088 = auStack_14d0._8_8_;
      auVar97._16_8_ = auStack_14d0._0_8_;
      auVar97._0_16_ = local_14e0;
      auVar97._24_8_ = auStack_14d0._8_8_;
      local_10c0 = local_1560._0_8_;
      uStack_10b8 = local_1560._8_8_;
      uStack_10b0 = auStack_1550._0_8_;
      uStack_10a8 = auStack_1550._8_8_;
      auVar99._16_8_ = auStack_1550._0_8_;
      auVar99._0_16_ = local_1560;
      auVar99._24_8_ = auStack_1550._8_8_;
      auVar21 = vfmadd213ps_fma(auVar97,auVar92,auVar99);
      local_1350 = local_1be0;
      local_1358 = &local_19a0;
      local_1020 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_1018 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_1010 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_1008 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar93._4_4_ = fStack_1adc;
      auVar93._0_4_ = local_1ae0;
      auVar93._8_4_ = fStack_1ad8;
      auVar93._12_4_ = fStack_1ad4;
      auVar93._16_4_ = fStack_1ad0;
      auVar93._20_4_ = fStack_1acc;
      auVar93._24_4_ = fStack_1ac8;
      auVar93._28_4_ = uStack_13e8._4_4_;
      local_1be0._0_8_ = auVar21._0_8_;
      local_1040 = local_1be0._0_8_;
      local_1be0._8_8_ = auVar21._8_8_;
      uStack_1038 = local_1be0._8_8_;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1060 = local_15e0._0_8_;
      uStack_1058 = local_15e0._8_8_;
      uStack_1050 = auStack_15d0._0_8_;
      uStack_1048 = auStack_15d0._8_8_;
      auVar101._16_8_ = auStack_15d0._0_8_;
      auVar101._0_16_ = local_15e0;
      auVar101._24_8_ = auStack_15d0._8_8_;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar93,auVar101);
      local_1368 = local_1bc0;
      local_1370 = &local_1960;
      local_fc0 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_fb8 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_fb0 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_fa8 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar94._4_4_ = fStack_1adc;
      auVar94._0_4_ = local_1ae0;
      auVar94._8_4_ = fStack_1ad8;
      auVar94._12_4_ = fStack_1ad4;
      auVar94._16_4_ = fStack_1ad0;
      auVar94._20_4_ = fStack_1acc;
      auVar94._24_4_ = fStack_1ac8;
      auVar94._28_4_ = uStack_13e8._4_4_;
      local_1bc0._0_8_ = auVar22._0_8_;
      local_fe0 = local_1bc0._0_8_;
      local_1bc0._8_8_ = auVar22._8_8_;
      uStack_fd8 = local_1bc0._8_8_;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_1000 = local_1660._0_8_;
      uStack_ff8 = local_1660._8_8_;
      uStack_ff0 = auStack_1650._0_8_;
      uStack_fe8 = auStack_1650._8_8_;
      auVar103._16_8_ = auStack_1650._0_8_;
      auVar103._0_16_ = local_1660;
      auVar103._24_8_ = auStack_1650._8_8_;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar94,auVar103);
      local_1380 = local_1ba0;
      local_1388 = &local_1920;
      local_f60 = CONCAT44(fStack_1adc,local_1ae0);
      uStack_f58 = CONCAT44(fStack_1ad4,fStack_1ad8);
      uStack_f50 = CONCAT44(fStack_1acc,fStack_1ad0);
      uStack_f48 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
      auVar95._4_4_ = fStack_1adc;
      auVar95._0_4_ = local_1ae0;
      auVar95._8_4_ = fStack_1ad8;
      auVar95._12_4_ = fStack_1ad4;
      auVar95._16_4_ = fStack_1ad0;
      auVar95._20_4_ = fStack_1acc;
      auVar95._24_4_ = fStack_1ac8;
      auVar95._28_4_ = uStack_13e8._4_4_;
      local_1ba0._0_8_ = auVar23._0_8_;
      local_f80 = local_1ba0._0_8_;
      local_1ba0._8_8_ = auVar23._8_8_;
      uStack_f78 = local_1ba0._8_8_;
      uStack_f70 = 0;
      uStack_f68 = 0;
      local_fa0 = local_16e0._0_8_;
      uStack_f98 = local_16e0._8_8_;
      uStack_f90 = auStack_16d0._0_8_;
      uStack_f88 = auStack_16d0._8_8_;
      auVar105._16_8_ = auStack_16d0._0_8_;
      auVar105._0_16_ = local_16e0;
      auVar105._24_8_ = auStack_16d0._8_8_;
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar95,auVar105);
      local_1390 = &local_1ac0;
      local_1398 = local_1b20;
      local_13a0 = local_1b80;
      local_f00 = CONCAT44(fStack_1abc,local_1ac0);
      uStack_ef8 = CONCAT44(fStack_1ab4,fStack_1ab8);
      uStack_ef0 = CONCAT44(fStack_1aac,fStack_1ab0);
      uStack_ee8 = CONCAT44(uStack_13e8._4_4_,fStack_1aa8);
      auVar96._4_4_ = fStack_1abc;
      auVar96._0_4_ = local_1ac0;
      auVar96._8_4_ = fStack_1ab8;
      auVar96._12_4_ = fStack_1ab4;
      auVar96._16_4_ = fStack_1ab0;
      auVar96._20_4_ = fStack_1aac;
      auVar96._24_4_ = fStack_1aa8;
      auVar96._28_4_ = uStack_13e8._4_4_;
      local_1b20._0_8_ = auVar123._0_8_;
      local_f20 = local_1b20._0_8_;
      local_1b20._8_8_ = auVar123._8_8_;
      uStack_f18 = local_1b20._8_8_;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_1b80._0_8_ = auVar24._0_8_;
      local_f40 = local_1b80._0_8_;
      local_1b80._8_8_ = auVar24._8_8_;
      uStack_f38 = local_1b80._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar96,ZEXT1632(auVar24));
      local_1b00._0_8_ = auVar25._0_8_;
      local_1b00._8_8_ = auVar25._8_8_;
      uStack_1470 = 0;
      uStack_1468 = 0;
      local_14a0 = local_1aa0._0_8_;
      uStack_1498 = local_1aa0._8_8_;
      uStack_1490 = local_1aa0._16_8_;
      uStack_1488 = local_1aa0._24_8_;
      local_1480._0_4_ = auVar25._0_4_;
      local_1480._4_4_ = auVar25._4_4_;
      uStack_1478._0_4_ = auVar25._8_4_;
      uStack_1478._4_4_ = auVar25._12_4_;
      fStack_1824 = uStack_13e8._4_4_;
      local_1840 = (float)local_1480 * (float)local_1400;
      fStack_183c = local_1480._4_4_ * local_1400._4_4_;
      fStack_1838 = (float)uStack_1478 * (float)uStack_13f8;
      fStack_1834 = uStack_1478._4_4_ * uStack_13f8._4_4_;
      fStack_1830 = (float)uStack_13f0 * 0.0;
      fStack_182c = uStack_13f0._4_4_ * 0.0;
      fStack_1828 = (float)uStack_13e8 * 0.0;
      local_12c0 = local_1a80._0_8_;
      uStack_12b8 = local_1a80._8_8_;
      uStack_12b0 = local_1a80._16_8_;
      uStack_12a8 = local_1a80._24_8_;
      local_12e0 = local_1720._0_8_;
      uStack_12d8 = local_1720._8_8_;
      uStack_12d0 = auStack_1710._0_8_;
      uStack_12c8 = auStack_1710._8_8_;
      auVar54._16_8_ = auStack_1710._0_8_;
      auVar54._0_16_ = local_1720;
      auVar54._24_8_ = auStack_1710._8_8_;
      _local_1860 = vpand_avx2(local_1a80,auVar54);
      local_ec0 = local_1840 + (float)local_1860._0_4_;
      fStack_ebc = fStack_183c + (float)local_1860._4_4_;
      fStack_eb8 = fStack_1838 + fStack_1858;
      fStack_eb4 = fStack_1834 + fStack_1854;
      fStack_eb0 = fStack_1830 + fStack_1850;
      fStack_eac = fStack_182c + fStack_184c;
      fStack_ea8 = fStack_1828 + fStack_1848;
      fStack_ea4 = uStack_13e8._4_4_ + fStack_1844;
      local_ee0 = local_1a40._0_8_;
      uStack_ed8 = local_1a40._8_8_;
      uStack_ed0 = local_1a40._16_8_;
      uStack_ec8 = local_1a40._24_8_;
      auVar57._4_4_ = fStack_ebc;
      auVar57._0_4_ = local_ec0;
      auVar57._8_4_ = fStack_eb8;
      auVar57._12_4_ = fStack_eb4;
      auVar57._16_4_ = fStack_eb0;
      auVar57._20_4_ = fStack_eac;
      auVar57._24_4_ = fStack_ea8;
      auVar57._28_4_ = fStack_ea4;
      _local_20e0 = vpor_avx2(auVar57,local_1a40);
      local_2100._0_4_ = local_2280._0_4_;
      local_2100._4_4_ = local_2280._4_4_;
      uStack_20f8._0_4_ = local_2280._8_4_;
      uStack_20f8._4_4_ = local_2280._12_4_;
      uStack_20f0._0_4_ = local_2280._16_4_;
      uStack_20f0._4_4_ = local_2280._20_4_;
      uStack_20e8._0_4_ = local_2280._24_4_;
      uStack_20e8._4_4_ = local_2280._28_4_;
      local_22a0 = (float)local_20e0._0_4_ + (float)local_2100;
      fStack_229c = (float)local_20e0._4_4_ + local_2100._4_4_;
      fStack_2298 = fStack_20d8 + (float)uStack_20f8;
      fStack_2294 = fStack_20d4 + uStack_20f8._4_4_;
      fStack_2290 = fStack_20d0 + (float)uStack_20f0;
      fStack_228c = fStack_20cc + uStack_20f0._4_4_;
      fStack_2288 = fStack_20c8 + (float)uStack_20e8;
      fStack_2284 = fStack_20c4 + uStack_20e8._4_4_;
      local_1c40 = local_2240._0_8_;
      uStack_1c38 = local_2240._8_8_;
      uStack_1c30 = local_2240._16_8_;
      uStack_1c28 = local_2240._24_8_;
      local_1c60 = local_2020._0_8_;
      uStack_1c58 = local_2020._8_8_;
      uStack_1c50 = auStack_2010._0_8_;
      uStack_1c48 = auStack_2010._8_8_;
      auVar51._16_8_ = auStack_2010._0_8_;
      auVar51._0_16_ = local_2020;
      auVar51._24_8_ = auStack_2010._8_8_;
      auVar124 = vpor_avx2(local_2240,auVar51);
      auVar14._16_8_ = auStack_2090._0_8_;
      auVar14._0_16_ = local_20a0;
      auVar14._24_8_ = auStack_2090._8_8_;
      local_22c0 = vcmpps_avx(auVar124,auVar14,1);
      local_1ec0 = local_2200._0_8_;
      uStack_1eb8 = local_2200._8_8_;
      uStack_1eb0 = local_2200._16_8_;
      uStack_1ea8 = local_2200._24_8_;
      local_1c80 = local_2260._0_8_;
      uStack_1c78 = local_2260._8_8_;
      uStack_1c70 = local_2260._16_8_;
      uStack_1c68 = local_2260._24_8_;
      local_1ca0 = local_1fe0._0_8_;
      uStack_1c98 = local_1fe0._8_8_;
      uStack_1c90 = auStack_1fd0._0_8_;
      uStack_1c88 = auStack_1fd0._8_8_;
      auVar50._16_8_ = auStack_1fd0._0_8_;
      auVar50._0_16_ = local_1fe0;
      auVar50._24_8_ = auStack_1fd0._8_8_;
      local_1ee0 = vpor_avx2(local_2260,auVar50);
      local_1d00 = vpand_avx2(local_2200,local_1ee0);
      local_d00 = local_2200._0_8_;
      uStack_cf8 = local_2200._8_8_;
      uStack_cf0 = local_2200._16_8_;
      uStack_ce8 = local_2200._24_8_;
      local_1f00 = local_22c0._0_8_;
      uStack_1ef8 = local_22c0._8_8_;
      uStack_1ef0 = local_22c0._16_8_;
      uStack_1ee8 = local_22c0._24_8_;
      local_1f20 = local_2020._0_8_;
      uStack_1f18 = local_2020._8_8_;
      uStack_1f10 = auStack_2010._0_8_;
      uStack_1f08 = auStack_2010._8_8_;
      auVar16._16_8_ = auStack_2010._0_8_;
      auVar16._0_16_ = local_2020;
      auVar16._24_8_ = auStack_2010._8_8_;
      local_1cc0 = vpand_avx2(local_22c0,auVar16);
      local_cc0 = local_22c0._0_8_;
      uStack_cb8 = local_22c0._8_8_;
      uStack_cb0 = local_22c0._16_8_;
      uStack_ca8 = local_22c0._24_8_;
      local_ce0 = local_20a0._0_8_;
      uStack_cd8 = local_20a0._8_8_;
      uStack_cd0 = auStack_2090._0_8_;
      uStack_cc8 = auStack_2090._8_8_;
      auVar60._16_8_ = auStack_2090._0_8_;
      auVar60._0_16_ = local_20a0;
      auVar60._24_8_ = auStack_2090._8_8_;
      local_1ce0 = vpandn_avx2(local_22c0,auVar60);
      local_d20 = vpor_avx2(local_1cc0,local_1ce0);
      local_1d20 = vpandn_avx2(local_2200,local_d20);
      local_22e0 = vpor_avx2(local_1d00,local_1d20);
      local_1f40 = local_2220._0_8_;
      uStack_1f38 = local_2220._8_8_;
      uStack_1f30 = local_2220._16_8_;
      uStack_1f28 = local_2220._24_8_;
      local_1f60 = CONCAT44(fStack_229c,local_22a0);
      uStack_1f58 = CONCAT44(fStack_2294,fStack_2298);
      uStack_1f50 = CONCAT44(fStack_228c,fStack_2290);
      uStack_1f48 = CONCAT44(fStack_2284,fStack_2288);
      auVar15._8_8_ = uStack_1f58;
      auVar15._0_8_ = local_1f60;
      auVar15._16_8_ = uStack_1f50;
      auVar15._24_8_ = uStack_1f48;
      local_1d40 = vpand_avx2(local_2220,auVar15);
      local_d40 = local_2220._0_8_;
      uStack_d38 = local_2220._8_8_;
      uStack_d30 = local_2220._16_8_;
      uStack_d28 = local_2220._24_8_;
      local_d60 = local_22e0._0_8_;
      uStack_d58 = local_22e0._8_8_;
      uStack_d50 = local_22e0._16_8_;
      uStack_d48 = local_22e0._24_8_;
      auVar124 = vpternlogq_avx512vl(local_2220,local_2220,local_2220,0xf);
      local_1d60 = vpand_avx2(auVar124,local_22e0);
      auVar124 = vpor_avx2(local_1d40,local_1d60);
      in_stack_ffffffffffffbf60 = auVar124._0_8_;
      in_stack_ffffffffffffbf68 = auVar124._8_8_;
      in_stack_ffffffffffffbf70 = auVar124._16_8_;
      in_stack_ffffffffffffbf78 = auVar124._24_8_;
      local_3c40 = local_3e30;
      *(undefined8 *)*local_3e30 = in_stack_ffffffffffffbf60;
      *(undefined8 *)(*local_3e30 + 8) = in_stack_ffffffffffffbf68;
      *(undefined8 *)(*local_3e30 + 0x10) = in_stack_ffffffffffffbf70;
      *(undefined8 *)(*local_3e30 + 0x18) = in_stack_ffffffffffffbf78;
      local_3e20 = local_3e20 + 1;
      local_3e28 = local_3e28 + 1;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x20);
      in_stack_ffffffffffffbf80 = local_39e0._0_8_;
      in_stack_ffffffffffffbf88 = local_39e0._8_8_;
      in_stack_ffffffffffffbf90 = auStack_39d0._0_8_;
      in_stack_ffffffffffffbf98 = auStack_39d0._8_8_;
      local_3c60 = in_stack_ffffffffffffbf60;
      uStack_3c58 = in_stack_ffffffffffffbf68;
      uStack_3c50 = in_stack_ffffffffffffbf70;
      uStack_3c48 = in_stack_ffffffffffffbf78;
      local_39c0 = local_3a6c;
      local_39bc = local_3a6c;
      local_39b8 = local_3a6c;
      local_39b4 = local_3a6c;
      local_39b0 = local_3a6c;
      local_39ac = local_3a6c;
      local_39a8 = local_3a6c;
      local_39a4 = local_3a6c;
      local_2140 = in_stack_ffffffffffffbfa0;
      uStack_2138 = in_stack_ffffffffffffbfa8;
      uStack_2130 = in_stack_ffffffffffffbfb0;
      local_2100 = local_2280._0_8_;
      uStack_20f8 = local_2280._8_8_;
      uStack_20f0 = local_2280._16_8_;
      uStack_20e8 = local_2280._24_8_;
      local_207c = local_2080;
      local_2078 = local_2080;
      local_2074 = local_2080;
      local_2070 = local_2080;
      local_206c = local_2080;
      local_2068 = local_2080;
      local_2064 = local_2080;
      local_203c = local_2040;
      local_2038 = local_2040;
      local_2034 = local_2040;
      local_2030 = local_2040;
      local_202c = local_2040;
      local_2028 = local_2040;
      local_2024 = local_2040;
      local_1ffc = local_2000;
      local_1ff8 = local_2000;
      local_1ff4 = local_2000;
      local_1ff0 = local_2000;
      local_1fec = local_2000;
      local_1fe8 = local_2000;
      local_1fe4 = local_2000;
      local_1fbc = local_1fc0;
      local_1fb8 = local_1fc0;
      local_1fb4 = local_1fc0;
      local_1fb0 = local_1fc0;
      local_1fac = local_1fc0;
      local_1fa8 = local_1fc0;
      local_1fa4 = local_1fc0;
      local_1fa0 = in_stack_ffffffffffffbfa0;
      uStack_1f98 = in_stack_ffffffffffffbfa8;
      uStack_1f90 = in_stack_ffffffffffffbfb0;
      uStack_1f88 = uStack_2128;
      local_1f80 = local_2120;
      uStack_1f78 = uStack_2118;
      uStack_1f70 = uStack_2110;
      uStack_1f68 = uStack_2108;
      local_1e20 = local_2120;
      uStack_1e18 = uStack_2118;
      uStack_1e10 = uStack_2110;
      uStack_1e08 = uStack_2108;
      local_1de0 = in_stack_ffffffffffffbfa0;
      uStack_1dd8 = in_stack_ffffffffffffbfa8;
      uStack_1dd0 = in_stack_ffffffffffffbfb0;
      uStack_1dc8 = uStack_2128;
      local_1be0 = ZEXT1632(auVar21);
      local_1bc0 = ZEXT1632(auVar22);
      local_1ba0 = ZEXT1632(auVar23);
      local_1b80 = ZEXT1632(auVar24);
      local_1b60 = ZEXT1632(auVar3);
      local_1b40 = ZEXT1632(auVar20);
      local_1b20 = ZEXT1632(auVar123);
      local_1b00 = ZEXT1632(auVar25);
      local_17bc = local_17c0;
      local_17b8 = local_17c0;
      local_17b4 = local_17c0;
      local_17b0 = local_17c0;
      local_17ac = local_17c0;
      local_17a8 = local_17c0;
      local_17a4 = local_17c0;
      local_177c = local_1780;
      local_1778 = local_1780;
      local_1774 = local_1780;
      local_1770 = local_1780;
      local_176c = local_1780;
      local_1768 = local_1780;
      local_1764 = local_1780;
      local_173c = local_1740;
      local_1738 = local_1740;
      local_1734 = local_1740;
      local_1730 = local_1740;
      local_172c = local_1740;
      local_1728 = local_1740;
      local_1724 = local_1740;
      local_16fc = local_1700;
      local_16f8 = local_1700;
      local_16f4 = local_1700;
      local_16f0 = local_1700;
      local_16ec = local_1700;
      local_16e8 = local_1700;
      local_16e4 = local_1700;
      local_16bc = local_16c0;
      local_16b8 = local_16c0;
      local_16b4 = local_16c0;
      local_16b0 = local_16c0;
      local_16ac = local_16c0;
      local_16a8 = local_16c0;
      local_16a4 = local_16c0;
      local_167c = local_1680;
      local_1678 = local_1680;
      local_1674 = local_1680;
      local_1670 = local_1680;
      local_166c = local_1680;
      local_1668 = local_1680;
      local_1664 = local_1680;
      local_163c = local_1640;
      local_1638 = local_1640;
      local_1634 = local_1640;
      local_1630 = local_1640;
      local_162c = local_1640;
      local_1628 = local_1640;
      local_1624 = local_1640;
      local_15fc = local_1600;
      local_15f8 = local_1600;
      local_15f4 = local_1600;
      local_15f0 = local_1600;
      local_15ec = local_1600;
      local_15e8 = local_1600;
      local_15e4 = local_1600;
      local_15bc = local_15c0;
      local_15b8 = local_15c0;
      local_15b4 = local_15c0;
      local_15b0 = local_15c0;
      local_15ac = local_15c0;
      local_15a8 = local_15c0;
      local_15a4 = local_15c0;
      local_157c = local_1580;
      local_1578 = local_1580;
      local_1574 = local_1580;
      local_1570 = local_1580;
      local_156c = local_1580;
      local_1568 = local_1580;
      local_1564 = local_1580;
      local_153c = local_1540;
      local_1538 = local_1540;
      local_1534 = local_1540;
      local_1530 = local_1540;
      local_152c = local_1540;
      local_1528 = local_1540;
      local_1524 = local_1540;
      local_14fc = local_1500;
      local_14f8 = local_1500;
      local_14f4 = local_1500;
      local_14f0 = local_1500;
      local_14ec = local_1500;
      local_14e8 = local_1500;
      local_14e4 = local_1500;
      local_14bc = local_14c0;
      local_14b8 = local_14c0;
      local_14b4 = local_14c0;
      local_14b0 = local_14c0;
      local_14ac = local_14c0;
      local_14a8 = local_14c0;
      local_14a4 = local_14c0;
      local_1480 = local_1b00._0_8_;
      uStack_1478 = local_1b00._8_8_;
      local_1440 = local_1460;
      uStack_1438 = uStack_1458;
      uStack_1430 = uStack_1450;
      uStack_1428 = uStack_1448;
      local_1400 = local_1420;
      uStack_13f8 = uStack_1418;
      uStack_13f0 = uStack_1410;
      uStack_13e8 = uStack_1408;
      local_1360 = local_1378;
      local_1348 = local_1378;
      local_1330 = local_1378;
      local_1318 = local_1378;
      local_1300 = local_1378;
      local_12e8 = local_1378;
    }
  }
  if (local_3e38 == 4) {
    for (iVar148 = 0; iVar148 + 3 < local_3e34; iVar148 = iVar148 + 4) {
      local_3e18 = local_3e20;
      local_4100 = *(undefined8 *)*local_3e20;
      uStackY_40f8 = *(undefined8 *)(*local_3e20 + 8);
      uStackY_40f0 = *(undefined8 *)(*local_3e20 + 0x10);
      uStackY_40e8 = *(undefined8 *)(*local_3e20 + 0x18);
      uStackY_40e0 = *(undefined8 *)local_3e20[1];
      uStackY_40d8 = *(undefined8 *)(local_3e20[1] + 8);
      uStackY_40d0 = *(undefined8 *)(local_3e20[1] + 0x10);
      local_3b50 = *local_3e28;
      local_4160 = CONCAT44(local_3b50,local_3b50);
      uStackY_4158 = CONCAT44(local_3b50,local_3b50);
      local_3b70 = local_3e28[1];
      uStackY_4150 = CONCAT44(local_3b70,local_3b70);
      uStackY_4148 = CONCAT44(local_3b70,local_3b70);
      local_3b90 = local_3e28[2];
      local_4180 = CONCAT44(local_3b90,local_3b90);
      uStackY_4178 = CONCAT44(local_3b90,local_3b90);
      local_3bb0 = local_3e28[3];
      uStackY_4170 = CONCAT44(local_3bb0,local_3bb0);
      uStackY_4168 = CONCAT44(local_3bb0,local_3bb0);
      auVar26._8_8_ = uStackY_4178;
      auVar26._0_8_ = local_4180;
      auVar26._16_8_ = uStackY_4170;
      auVar26._24_8_ = uStackY_4168;
      local_41c0 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(uStackY_4148,
                                                 CONCAT816(uStackY_4150,
                                                           CONCAT88(uStackY_4158,local_4160)))),
                              auVar26,1);
      local_3990 = &local_3e39;
      local_3998 = &local_4100;
      local_39a0 = local_41c0;
      y_01[2] = (float)(int)in_stack_ffffffffffffbf80;
      y_01[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y_01[0] = (float)(int)in_stack_ffffffffffffbf78;
      y_01[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y_01[4] = (float)(int)in_stack_ffffffffffffbf88;
      y_01[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y_01[6] = (float)(int)in_stack_ffffffffffffbf90;
      y_01[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y_01[8] = (float)(int)in_stack_ffffffffffffbf98;
      y_01[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y_01[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y_01[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y_01[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x_01[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x_01[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x_01[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x_01[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x_01[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x_01[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x_01[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x_01._0_8_ = *(undefined8 *)(local_3e20[1] + 0x18);
      x_01[9] = (float)iVar148;
      x_01[10] = (float)(int)in_stack_ffffffffffffbf60;
      x_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x_01[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x_01[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      local_4140 = uStackY_4170;
      uStackY_4138 = uStackY_4168;
      local_4130 = local_4180;
      uStackY_4128 = uStackY_4178;
      local_4120 = uStackY_4150;
      uStackY_4118 = uStackY_4148;
      local_4110 = local_4160;
      uStackY_4108 = uStackY_4158;
      uStack_3bac = local_3bb0;
      uStack_3ba8 = local_3bb0;
      uStack_3ba4 = local_3bb0;
      local_3b94 = local_3bb0;
      uStack_3b8c = local_3b90;
      uStack_3b88 = local_3b90;
      uStack_3b84 = local_3b90;
      local_3b74 = local_3b90;
      uStack_3b6c = local_3b70;
      uStack_3b68 = local_3b70;
      uStack_3b64 = local_3b70;
      local_3b54 = local_3b70;
      uStack_3b4c = local_3b50;
      uStack_3b48 = local_3b50;
      uStack_3b44 = local_3b50;
      local_3b34 = local_3b50;
      local_3b20 = local_4180;
      uStack_3b18 = uStackY_4178;
      local_3b10 = local_4160;
      uStack_3b08 = uStackY_4158;
      local_3b00 = local_4160;
      uStack_3af8 = uStackY_4158;
      uStack_3af0 = uStackY_4150;
      uStack_3ae8 = uStackY_4148;
      atan2512_ps(y_01,x_01);
      local_3d88 = local_3e30;
      auVar27._8_8_ = local_41c0._8_8_;
      auVar27._0_8_ = local_41c0._0_8_;
      auVar27._16_8_ = local_41c0._16_8_;
      auVar27._24_8_ = local_41c0._24_8_;
      auVar27._32_8_ = local_41c0._32_8_;
      auVar27._40_8_ = local_41c0._40_8_;
      auVar27._48_8_ = local_41c0._48_8_;
      auVar27._56_8_ = local_41c0._56_8_;
      *local_3e30 = auVar27;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 4;
      local_3e30 = local_3e30 + 1;
      local_3e00 = local_41c0._0_8_;
      uStack_3df8 = local_41c0._8_8_;
      uStack_3df0 = local_41c0._16_8_;
      uStack_3de8 = local_41c0._24_8_;
      uStack_3de0 = local_41c0._32_8_;
      uStack_3dd8 = local_41c0._40_8_;
      uStack_3dd0 = local_41c0._48_8_;
      uStack_3dc8 = local_41c0._56_8_;
    }
    for (; iVar148 + 1 < local_3e34; iVar148 = iVar148 + 2) {
      uVar1 = *local_3e28;
      uVar138 = CONCAT44(uVar1,uVar1);
      uVar143 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3e28[1];
      uVar128 = CONCAT44(uVar1,uVar1);
      uVar133 = CONCAT44(uVar1,uVar1);
      auVar67._8_8_ = uVar143;
      auVar67._0_8_ = uVar138;
      auVar67._16_8_ = uVar128;
      auVar67._24_8_ = uVar133;
      auVar66._8_8_ = uVar143;
      auVar66._0_8_ = uVar138;
      auVar66._16_8_ = uVar128;
      auVar66._24_8_ = uVar133;
      auVar65._8_8_ = uVar143;
      auVar65._0_8_ = uVar138;
      auVar65._16_8_ = uVar128;
      auVar65._24_8_ = uVar133;
      auVar64._8_8_ = uVar143;
      auVar64._0_8_ = uVar138;
      auVar64._16_8_ = uVar128;
      auVar64._24_8_ = uVar133;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x30);
      uStack_36f0 = auVar20._0_8_;
      uStack_36e8 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar123 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x80000000),0x20);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x80000000),0x30);
      uStack_36b0 = auVar123._0_8_;
      uStack_36a8 = auVar123._8_8_;
      auVar123 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x40490fdb),0x20);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x40490fdb),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x30);
      uStack_3670 = auVar21._0_8_;
      uStack_3668 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x30);
      uStack_3630 = auVar22._0_8_;
      uStack_3628 = auVar22._8_8_;
      auVar30._16_8_ = uStack_36f0;
      auVar30._0_16_ = auVar3;
      auVar30._24_8_ = uStack_36e8;
      auVar124 = vcmpps_avx(*local_3e20,auVar30,4);
      auVar31._16_8_ = uStack_36f0;
      auVar31._0_16_ = auVar3;
      auVar31._24_8_ = uStack_36e8;
      auVar2 = vcmpps_avx(auVar64,auVar31,4);
      auVar13 = vpand_avx2(auVar124,auVar2);
      auVar38._16_8_ = uStack_36b0;
      auVar38._0_16_ = auVar20;
      auVar38._24_8_ = uStack_36a8;
      auVar14 = vpand_avx2(auVar38,*local_3e20);
      auVar37._16_8_ = uStack_36b0;
      auVar37._0_16_ = auVar20;
      auVar37._24_8_ = uStack_36a8;
      auVar15 = vpand_avx2(auVar37,auVar65);
      auVar32._16_8_ = uStack_36f0;
      auVar32._0_16_ = auVar3;
      auVar32._24_8_ = uStack_36e8;
      auVar124 = vcmpps_avx(*local_3e20,auVar32,1);
      auVar125 = vcmpps_avx(auVar66,auVar32,1);
      auVar36._16_8_ = uStack_36b0;
      auVar36._0_16_ = auVar20;
      auVar36._24_8_ = uStack_36a8;
      auVar125 = vpand_avx2(auVar125,auVar36);
      auVar41._16_8_ = uStack_3670;
      auVar41._0_16_ = auVar123;
      auVar41._24_8_ = uStack_3668;
      auVar125 = vpor_avx2(auVar125,auVar41);
      auVar16 = vpand_avx2(auVar124,auVar125);
      auVar124 = vdivps_avx(auVar67,*local_3e20);
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x30);
      uStack_2e30 = auVar22._0_8_;
      uStack_2e28 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x30);
      uStack_2df0 = auVar23._0_8_;
      uStack_2de8 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x30);
      uStack_2db0 = auVar24._0_8_;
      uStack_2da8 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x30);
      uStack_2d70 = auVar25._0_8_;
      uStack_2d68 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      uStack_2d30 = auVar4._0_8_;
      uStack_2d28 = auVar4._8_8_;
      auVar4 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x30);
      uStack_2cf0 = auVar5._0_8_;
      uStack_2ce8 = auVar5._8_8_;
      auVar5 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x30);
      auVar6 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x30);
      uStack_2cb0 = auVar6._0_8_;
      uStack_2ca8 = auVar6._8_8_;
      auVar6 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x30);
      auVar7 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x30);
      uStack_2c70 = auVar7._0_8_;
      uStack_2c68 = auVar7._8_8_;
      auVar7 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x30);
      uStack_2c30 = auVar8._0_8_;
      uStack_2c28 = auVar8._8_8_;
      auVar8 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x30);
      uStack_2bf0 = auVar9._0_8_;
      uStack_2be8 = auVar9._8_8_;
      auVar9 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x30);
      auVar10 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x30);
      uStack_2bb0 = auVar10._0_8_;
      uStack_2ba8 = auVar10._8_8_;
      auVar10 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x30);
      auVar11 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x30);
      uStack_2b70 = auVar11._0_8_;
      uStack_2b68 = auVar11._8_8_;
      auVar11 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x30);
      auVar12 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x20);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x30);
      uStack_2b30 = auVar12._0_8_;
      uStack_2b28 = auVar12._8_8_;
      auVar45._16_8_ = uStack_2e30;
      auVar45._0_16_ = auVar20;
      auVar45._24_8_ = uStack_2e28;
      auVar17 = vpand_avx2(auVar45,auVar124);
      auVar48._16_8_ = uStack_2e30;
      auVar48._0_16_ = auVar20;
      auVar48._24_8_ = uStack_2e28;
      auVar18 = vpandn_avx2(auVar48,auVar124);
      auVar42._16_8_ = uStack_2df0;
      auVar42._0_16_ = auVar22;
      auVar42._24_8_ = uStack_2de8;
      auVar124 = vcmpps_avx(auVar42,auVar18,1);
      auVar44._16_8_ = uStack_2db0;
      auVar44._0_16_ = auVar23;
      auVar44._24_8_ = uStack_2da8;
      auVar125 = vpand_avx2(auVar124,auVar44);
      auVar19 = vpandn_avx2(auVar124,auVar18);
      auVar19 = vpor_avx2(auVar125,auVar19);
      auVar125 = vpand_avx2(auVar124,auVar18);
      auVar47._16_8_ = uStack_2df0;
      auVar47._0_16_ = auVar22;
      auVar47._24_8_ = uStack_2de8;
      auVar18 = vpandn_avx2(auVar124,auVar47);
      auVar125 = vpor_avx2(auVar125,auVar18);
      auVar125 = vdivps_avx(auVar19,auVar125);
      local_2a60 = auVar125._0_4_;
      fStack_2a5c = auVar125._4_4_;
      fStack_2a58 = auVar125._8_4_;
      fStack_2a54 = auVar125._12_4_;
      fStack_2a50 = auVar125._16_4_;
      fStack_2a4c = auVar125._20_4_;
      fStack_2a48 = auVar125._24_4_;
      fStack_2a44 = auVar125._28_4_;
      fVar126 = local_2a60 * local_2a60;
      fVar129 = fStack_2a5c * fStack_2a5c;
      fVar131 = fStack_2a58 * fStack_2a58;
      fVar134 = fStack_2a54 * fStack_2a54;
      fVar136 = fStack_2a50 * fStack_2a50;
      fVar139 = fStack_2a4c * fStack_2a4c;
      fVar141 = fStack_2a48 * fStack_2a48;
      fVar127 = fVar126 * fVar126;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar135 = fVar134 * fVar134;
      fVar137 = fVar136 * fVar136;
      fVar140 = fVar139 * fVar139;
      fVar142 = fVar141 * fVar141;
      auVar72._4_4_ = fVar130;
      auVar72._0_4_ = fVar127;
      auVar72._8_4_ = fVar132;
      auVar72._12_4_ = fVar135;
      auVar72._16_4_ = fVar137;
      auVar72._20_4_ = fVar140;
      auVar72._24_4_ = fVar142;
      auVar72._28_4_ = fStack_2a44;
      auVar81._16_8_ = uStack_2b70;
      auVar81._0_16_ = auVar10;
      auVar81._24_8_ = uStack_2b68;
      auVar83._16_8_ = uStack_2bf0;
      auVar83._0_16_ = auVar8;
      auVar83._24_8_ = uStack_2be8;
      auVar20 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
      auVar73._4_4_ = fVar130;
      auVar73._0_4_ = fVar127;
      auVar73._8_4_ = fVar132;
      auVar73._12_4_ = fVar135;
      auVar73._16_4_ = fVar137;
      auVar73._20_4_ = fVar140;
      auVar73._24_4_ = fVar142;
      auVar73._28_4_ = fStack_2a44;
      auVar85._16_8_ = uStack_2c70;
      auVar85._0_16_ = auVar6;
      auVar85._24_8_ = uStack_2c68;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar73,auVar85);
      auVar74._4_4_ = fVar130;
      auVar74._0_4_ = fVar127;
      auVar74._8_4_ = fVar132;
      auVar74._12_4_ = fVar135;
      auVar74._16_4_ = fVar137;
      auVar74._20_4_ = fVar140;
      auVar74._24_4_ = fVar142;
      auVar74._28_4_ = fStack_2a44;
      auVar87._16_8_ = uStack_2cf0;
      auVar87._0_16_ = auVar4;
      auVar87._24_8_ = uStack_2ce8;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar74,auVar87);
      auVar75._4_4_ = fVar130;
      auVar75._0_4_ = fVar127;
      auVar75._8_4_ = fVar132;
      auVar75._12_4_ = fVar135;
      auVar75._16_4_ = fVar137;
      auVar75._20_4_ = fVar140;
      auVar75._24_4_ = fVar142;
      auVar75._28_4_ = fStack_2a44;
      auVar80._16_8_ = uStack_2b30;
      auVar80._0_16_ = auVar11;
      auVar80._24_8_ = uStack_2b28;
      auVar82._16_8_ = uStack_2bb0;
      auVar82._0_16_ = auVar9;
      auVar82._24_8_ = uStack_2ba8;
      auVar22 = vfmadd213ps_fma(auVar80,auVar75,auVar82);
      auVar76._4_4_ = fVar130;
      auVar76._0_4_ = fVar127;
      auVar76._8_4_ = fVar132;
      auVar76._12_4_ = fVar135;
      auVar76._16_4_ = fVar137;
      auVar76._20_4_ = fVar140;
      auVar76._24_4_ = fVar142;
      auVar76._28_4_ = fStack_2a44;
      auVar84._16_8_ = uStack_2c30;
      auVar84._0_16_ = auVar7;
      auVar84._24_8_ = uStack_2c28;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar76,auVar84);
      auVar77._4_4_ = fVar130;
      auVar77._0_4_ = fVar127;
      auVar77._8_4_ = fVar132;
      auVar77._12_4_ = fVar135;
      auVar77._16_4_ = fVar137;
      auVar77._20_4_ = fVar140;
      auVar77._24_4_ = fVar142;
      auVar77._28_4_ = fStack_2a44;
      auVar86._16_8_ = uStack_2cb0;
      auVar86._0_16_ = auVar5;
      auVar86._24_8_ = uStack_2ca8;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar77,auVar86);
      auVar78._4_4_ = fVar130;
      auVar78._0_4_ = fVar127;
      auVar78._8_4_ = fVar132;
      auVar78._12_4_ = fVar135;
      auVar78._16_4_ = fVar137;
      auVar78._20_4_ = fVar140;
      auVar78._24_4_ = fVar142;
      auVar78._28_4_ = fStack_2a44;
      auVar88._16_8_ = uStack_2d30;
      auVar88._0_16_ = auVar25;
      auVar88._24_8_ = uStack_2d28;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar78,auVar88);
      auVar79._4_4_ = fVar129;
      auVar79._0_4_ = fVar126;
      auVar79._8_4_ = fVar131;
      auVar79._12_4_ = fVar134;
      auVar79._16_4_ = fVar136;
      auVar79._20_4_ = fVar139;
      auVar79._24_4_ = fVar141;
      auVar79._28_4_ = fStack_2a44;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar79,ZEXT1632(auVar22));
      local_2ae0 = auVar20._0_4_;
      fStack_2adc = auVar20._4_4_;
      fStack_2ad8 = auVar20._8_4_;
      fStack_2ad4 = auVar20._12_4_;
      auVar43._16_8_ = uStack_2d70;
      auVar43._0_16_ = auVar24;
      auVar43._24_8_ = uStack_2d68;
      auVar124 = vpand_avx2(auVar124,auVar43);
      local_2ec0 = auVar124._0_4_;
      fStack_2ebc = auVar124._4_4_;
      fStack_2eb8 = auVar124._8_4_;
      fStack_2eb4 = auVar124._12_4_;
      fStack_2eb0 = auVar124._16_4_;
      fStack_2eac = auVar124._20_4_;
      fStack_2ea8 = auVar124._24_4_;
      fStack_2ea4 = auVar124._28_4_;
      auVar46._4_4_ = fStack_2adc * fStack_2a5c + fStack_2ebc;
      auVar46._0_4_ = local_2ae0 * local_2a60 + local_2ec0;
      auVar46._8_4_ = fStack_2ad8 * fStack_2a58 + fStack_2eb8;
      auVar46._12_4_ = fStack_2ad4 * fStack_2a54 + fStack_2eb4;
      auVar46._16_4_ = fStack_2a50 * 0.0 + fStack_2eb0;
      auVar46._20_4_ = fStack_2a4c * 0.0 + fStack_2eac;
      auVar46._24_4_ = fStack_2a48 * 0.0 + fStack_2ea8;
      auVar46._28_4_ = fStack_2a44 + fStack_2ea4;
      auVar124 = vpor_avx2(auVar46,auVar17);
      local_3740 = auVar124._0_4_;
      fStack_373c = auVar124._4_4_;
      fStack_3738 = auVar124._8_4_;
      fStack_3734 = auVar124._12_4_;
      fStack_3730 = auVar124._16_4_;
      fStack_372c = auVar124._20_4_;
      fStack_3728 = auVar124._24_4_;
      fStack_3724 = auVar124._28_4_;
      local_3760 = auVar16._0_4_;
      fStack_375c = auVar16._4_4_;
      fStack_3758 = auVar16._8_4_;
      fStack_3754 = auVar16._12_4_;
      fStack_3750 = auVar16._16_4_;
      fStack_374c = auVar16._20_4_;
      fStack_3748 = auVar16._24_4_;
      fStack_3744 = auVar16._28_4_;
      auVar40._16_8_ = uStack_3670;
      auVar40._0_16_ = auVar123;
      auVar40._24_8_ = uStack_3668;
      auVar124 = vpor_avx2(auVar14,auVar40);
      auVar33._16_8_ = uStack_36f0;
      auVar33._0_16_ = auVar3;
      auVar33._24_8_ = uStack_36e8;
      auVar124 = vcmpps_avx(auVar124,auVar33,1);
      auVar39._16_8_ = uStack_3630;
      auVar39._0_16_ = auVar21;
      auVar39._24_8_ = uStack_3628;
      auVar125 = vpor_avx2(auVar15,auVar39);
      auVar125 = vpand_avx2(auVar2,auVar125);
      auVar35._16_8_ = uStack_3670;
      auVar35._0_16_ = auVar123;
      auVar35._24_8_ = uStack_3668;
      auVar14 = vpand_avx2(auVar124,auVar35);
      auVar49._16_8_ = uStack_36f0;
      auVar49._0_16_ = auVar3;
      auVar49._24_8_ = uStack_36e8;
      auVar124 = vpandn_avx2(auVar124,auVar49);
      auVar124 = vpor_avx2(auVar14,auVar124);
      auVar124 = vpandn_avx2(auVar2,auVar124);
      auVar2 = vpor_avx2(auVar125,auVar124);
      auVar34._4_4_ = fStack_373c + fStack_375c;
      auVar34._0_4_ = local_3740 + local_3760;
      auVar34._12_4_ = fStack_3734 + fStack_3754;
      auVar34._8_4_ = fStack_3738 + fStack_3758;
      auVar34._20_4_ = fStack_372c + fStack_374c;
      auVar34._16_4_ = fStack_3730 + fStack_3750;
      auVar34._28_4_ = fStack_3724 + fStack_3744;
      auVar34._24_4_ = fStack_3728 + fStack_3748;
      auVar124 = vpand_avx2(auVar13,auVar34);
      auVar125 = vpternlogq_avx512vl(auVar13,auVar13,auVar13,0xf);
      auVar2 = vpand_avx2(auVar125,auVar2);
      auVar124 = vpor_avx2(auVar124,auVar2);
      local_4280 = auVar124._0_8_;
      uStackY_4278 = auVar124._8_8_;
      uStackY_4270 = auVar124._16_8_;
      uStackY_4268 = auVar124._24_8_;
      *(undefined8 *)*local_3e30 = local_4280;
      *(undefined8 *)(*local_3e30 + 8) = uStackY_4278;
      *(undefined8 *)(*local_3e30 + 0x10) = uStackY_4270;
      *(undefined8 *)(*local_3e30 + 0x18) = uStackY_4268;
      local_3e20 = local_3e20 + 1;
      local_3e28 = local_3e28 + 2;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x20);
    }
    for (; iVar148 < local_3e34; iVar148 = iVar148 + 1) {
      uVar1 = *local_3e28;
      uVar128 = CONCAT44(uVar1,uVar1);
      uVar133 = CONCAT44(uVar1,uVar1);
      auVar63._8_8_ = uVar133;
      auVar63._0_8_ = uVar128;
      auVar62._8_8_ = uVar133;
      auVar62._0_8_ = uVar128;
      auVar61._8_8_ = uVar133;
      auVar61._0_8_ = uVar128;
      auVar20._8_8_ = uVar133;
      auVar20._0_8_ = uVar128;
      auVar3 = vcmpps_avx(*(undefined1 (*) [16])*local_3e20,ZEXT816(0),4);
      auVar20 = vcmpps_avx(auVar20,ZEXT816(0),4);
      auVar21 = vpand_avx(auVar3,auVar20);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar22 = vpand_avx(auVar23,*(undefined1 (*) [16])*local_3e20);
      auVar123._8_8_ = 0x8000000080000000;
      auVar123._0_8_ = 0x8000000080000000;
      auVar23 = vpand_avx(auVar123,auVar61);
      auVar3 = vcmpps_avx(*(undefined1 (*) [16])*local_3e20,ZEXT816(0),1);
      auVar123 = vcmpps_avx(auVar62,ZEXT816(0),1);
      auVar24._8_8_ = 0x8000000080000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar123 = vpand_avx(auVar123,auVar24);
      auVar5._8_8_ = 0x40490fdb40490fdb;
      auVar5._0_8_ = 0x40490fdb40490fdb;
      auVar123 = vpor_avx(auVar123,auVar5);
      auVar24 = vpand_avx(auVar3,auVar123);
      auVar3 = vdivps_avx(auVar63,*(undefined1 (*) [16])*local_3e20);
      auVar8._8_8_ = 0x8000000080000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar25 = vpand_avx(auVar8,auVar3);
      auVar12._8_8_ = 0x8000000080000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar4 = vpandn_avx(auVar12,auVar3);
      auVar10._8_8_ = 0x3f8000003f800000;
      auVar10._0_8_ = 0x3f8000003f800000;
      auVar3 = vcmpps_avx(auVar10,auVar4,1);
      auVar7._8_8_ = 0xbf800000bf800000;
      auVar7._0_8_ = 0xbf800000bf800000;
      auVar123 = vpand_avx(auVar3,auVar7);
      auVar5 = vpandn_avx(auVar3,auVar4);
      auVar5 = vpor_avx(auVar123,auVar5);
      auVar123 = vpand_avx(auVar3,auVar4);
      auVar11._8_8_ = 0x3f8000003f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar4 = vpandn_avx(auVar3,auVar11);
      auVar123 = vpor_avx(auVar123,auVar4);
      auVar123 = vdivps_avx(auVar5,auVar123);
      local_630 = auVar123._0_4_;
      fStack_62c = auVar123._4_4_;
      fStack_628 = auVar123._8_4_;
      fStack_624 = auVar123._12_4_;
      fVar126 = local_630 * local_630;
      fVar129 = fStack_62c * fStack_62c;
      fVar131 = fStack_628 * fStack_628;
      fVar134 = fStack_624 * fStack_624;
      fVar127 = fVar126 * fVar126;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar135 = fVar134 * fVar134;
      auVar106._4_4_ = fVar130;
      auVar106._0_4_ = fVar127;
      auVar106._8_4_ = fVar132;
      auVar106._12_4_ = fVar135;
      auVar115._8_8_ = 0xbc83a25cbc83a25c;
      auVar115._0_8_ = 0xbc83a25cbc83a25c;
      auVar117._8_8_ = 0xbd99b01ebd99b01e;
      auVar117._0_8_ = 0xbd99b01ebd99b01e;
      auVar123 = vfmadd213ps_fma(auVar115,auVar106,auVar117);
      auVar107._4_4_ = fVar130;
      auVar107._0_4_ = fVar127;
      auVar107._8_4_ = fVar132;
      auVar107._12_4_ = fVar135;
      auVar119._8_8_ = 0xbe117200be117200;
      auVar119._0_8_ = 0xbe117200be117200;
      auVar123 = vfmadd213ps_fma(auVar123,auVar107,auVar119);
      auVar108._4_4_ = fVar130;
      auVar108._0_4_ = fVar127;
      auVar108._8_4_ = fVar132;
      auVar108._12_4_ = fVar135;
      auVar121._8_8_ = 0xbeaaaa53beaaaa53;
      auVar121._0_8_ = 0xbeaaaa53beaaaa53;
      auVar123 = vfmadd213ps_fma(auVar123,auVar108,auVar121);
      auVar109._4_4_ = fVar130;
      auVar109._0_4_ = fVar127;
      auVar109._8_4_ = fVar132;
      auVar109._12_4_ = fVar135;
      auVar114._8_8_ = 0x3b3ac5373b3ac537;
      auVar114._0_8_ = 0x3b3ac5373b3ac537;
      auVar116._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar116._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar4 = vfmadd213ps_fma(auVar114,auVar109,auVar116);
      auVar110._4_4_ = fVar130;
      auVar110._0_4_ = fVar127;
      auVar110._8_4_ = fVar132;
      auVar110._12_4_ = fVar135;
      auVar118._8_8_ = 0x3dd9ed243dd9ed24;
      auVar118._0_8_ = 0x3dd9ed243dd9ed24;
      auVar4 = vfmadd213ps_fma(auVar4,auVar110,auVar118);
      auVar111._4_4_ = fVar130;
      auVar111._0_4_ = fVar127;
      auVar111._8_4_ = fVar132;
      auVar111._12_4_ = fVar135;
      auVar120._8_8_ = 0x3e4cb9743e4cb974;
      auVar120._0_8_ = 0x3e4cb9743e4cb974;
      auVar4 = vfmadd213ps_fma(auVar4,auVar111,auVar120);
      auVar112._4_4_ = fVar130;
      auVar112._0_4_ = fVar127;
      auVar112._8_4_ = fVar132;
      auVar112._12_4_ = fVar135;
      auVar122._8_8_ = 0x3f8000003f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar4 = vfmadd213ps_fma(auVar4,auVar112,auVar122);
      auVar113._4_4_ = fVar129;
      auVar113._0_4_ = fVar126;
      auVar113._8_4_ = fVar131;
      auVar113._12_4_ = fVar134;
      auVar123 = vfmadd213ps_fma(auVar123,auVar113,auVar4);
      local_670 = auVar123._0_4_;
      fStack_66c = auVar123._4_4_;
      fStack_668 = auVar123._8_4_;
      fStack_664 = auVar123._12_4_;
      auVar6._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar6._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar3 = vpand_avx(auVar3,auVar6);
      local_6a0 = auVar3._0_4_;
      fStack_69c = auVar3._4_4_;
      fStack_698 = auVar3._8_4_;
      fStack_694 = auVar3._12_4_;
      auVar9._4_4_ = fStack_66c * fStack_62c + fStack_69c;
      auVar9._0_4_ = local_670 * local_630 + local_6a0;
      auVar9._8_4_ = fStack_668 * fStack_628 + fStack_698;
      auVar9._12_4_ = fStack_664 * fStack_624 + fStack_694;
      auVar3 = vpor_avx(auVar9,auVar25);
      local_b80 = auVar3._0_4_;
      fStack_b7c = auVar3._4_4_;
      fStack_b78 = auVar3._8_4_;
      fStack_b74 = auVar3._12_4_;
      local_b90 = auVar24._0_4_;
      fStack_b8c = auVar24._4_4_;
      fStack_b88 = auVar24._8_4_;
      fStack_b84 = auVar24._12_4_;
      auVar4._8_8_ = 0x40490fdb40490fdb;
      auVar4._0_8_ = 0x40490fdb40490fdb;
      auVar3 = vpor_avx(auVar22,auVar4);
      auVar3 = vcmpps_avx(auVar3,ZEXT816(0),1);
      auVar25._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar25._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar123 = vpor_avx(auVar23,auVar25);
      auVar123 = vpand_avx(auVar20,auVar123);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar22 = vpand_avx(auVar3,auVar22);
      auVar3 = vpandn_avx(auVar3,ZEXT816(0));
      auVar3 = vpor_avx(auVar22,auVar3);
      auVar3 = vpandn_avx(auVar20,auVar3);
      auVar20 = vpor_avx(auVar123,auVar3);
      auVar3._4_4_ = fStack_b7c + fStack_b8c;
      auVar3._0_4_ = local_b80 + local_b90;
      auVar3._12_4_ = fStack_b74 + fStack_b84;
      auVar3._8_4_ = fStack_b78 + fStack_b88;
      auVar3 = vpand_avx(auVar21,auVar3);
      auVar123 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
      auVar20 = vpand_avx(auVar123,auVar20);
      auVar3 = vpor_avx(auVar3,auVar20);
      local_42b0 = auVar3._0_8_;
      uStackY_42a8 = auVar3._8_8_;
      *(undefined8 *)*local_3e30 = local_42b0;
      *(undefined8 *)(*local_3e30 + 8) = uStackY_42a8;
      local_3e20 = (undefined1 (*) [32])(*local_3e20 + 0x10);
      local_3e28 = local_3e28 + 1;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x10);
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}